

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool parsePara(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  Strategy SVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  allocator local_51;
  string branch;
  
  iVar5 = 1;
  do {
    if (argc <= iVar5) {
LAB_001045b5:
      return elf_file_name != (char *)0x0 && argc <= iVar5;
    }
    pcVar2 = argv[iVar5];
    if (*pcVar2 == '-') {
      cVar1 = pcVar2[1];
      if (cVar1 == 'b') {
        iVar6 = iVar5 + 1;
        if (argc <= iVar6) goto LAB_001045b5;
        std::__cxx11::string::string((string *)&branch,argv[iVar6],&local_51);
        bVar4 = std::operator==(&branch,"AT");
        SVar3 = AT;
        if (!bVar4) {
          bVar4 = std::operator==(&branch,"NT");
          SVar3 = NT;
          if (!bVar4) {
            bVar4 = std::operator==(&branch,"BTFNT");
            SVar3 = BTFNT;
            if (!bVar4) {
              bVar4 = std::operator==(&branch,"BPB");
              SVar3 = BPB;
              if (!bVar4) {
                std::__cxx11::string::~string((string *)&branch);
                goto LAB_001045b5;
              }
            }
          }
        }
        strategy = SVar3;
        std::__cxx11::string::~string((string *)&branch);
        iVar5 = iVar6;
        pcVar2 = elf_file_name;
      }
      else {
        pcVar2 = elf_file_name;
        if (cVar1 == 'd') {
          dump_history = true;
        }
        else if (cVar1 == 's') {
          single_step = true;
        }
        else {
          if (cVar1 != 'v') goto LAB_001045b5;
          verbose = true;
        }
      }
    }
    elf_file_name = pcVar2;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

bool parsePara(int argc, char **argv) {
    for (int i = 1; i < argc; i++) {
        if (argv[i][0] == '-') {
            switch (argv[i][1]) {
                case 'v':
                    verbose = true;
                    break;
                case 's':
                    single_step = true;
                    break;
                case 'd':
                    dump_history = true;
                    break;
                case 'b':
                    if (i + 1 < argc) {
                        string branch = argv[++i];
                        if (branch == "AT") {
                            strategy = BranchPredictor::Strategy::AT;
                        } else if (branch == "NT") {
                            strategy = BranchPredictor::Strategy::NT;
                        } else if (branch == "BTFNT") {
                            strategy = BranchPredictor::Strategy::BTFNT;
                        } else if (branch == "BPB") {
                            strategy = BranchPredictor::Strategy::BPB;
                        } else {
                            return false;
                        }
                    } else {
                        return false;
                    }
                    break;
                default:
                    return false;
            }
        } else {
            elf_file_name = argv[i];
        }
    }

    return elf_file_name != nullptr;
}